

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_button_color(nk_context *ctx,nk_color color)

{
  nk_rect r;
  nk_widget_layout_states nVar1;
  nk_bool nVar2;
  nk_color in_ESI;
  nk_style_button *in_RDI;
  nk_widget_layout_states state;
  nk_rect content;
  nk_rect bounds;
  int ret;
  nk_style_button button;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_style_button *style;
  nk_style_item_type in_stack_fffffffffffffea0;
  nk_flags in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined8 in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  nk_command_buffer *in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined8 in_stack_fffffffffffffed8;
  float in_stack_fffffffffffffee0;
  undefined1 local_d8 [176];
  nk_style_button *local_28;
  long local_20;
  long local_18;
  nk_style_button *local_10;
  nk_color local_8;
  nk_bool local_4;
  
  if (((in_RDI == (nk_style_button *)0x0) || (*(long *)((long)&in_RDI[0x5e].hover.data + 0x10) == 0)
      ) || (*(long *)(*(long *)((long)&in_RDI[0x5e].hover.data + 0x10) + 0xa8) == 0)) {
    local_4 = 0;
  }
  else {
    local_18 = *(long *)((long)&in_RDI[0x5e].hover.data + 0x10);
    local_20 = *(long *)(local_18 + 0xa8);
    local_10 = in_RDI;
    local_8 = in_ESI;
    nVar1 = nk_widget((nk_rect *)in_stack_fffffffffffffed8,
                      (nk_context *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (nVar1 == NK_WIDGET_INVALID) {
      local_4 = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) || (style = local_10, (*(uint *)(local_20 + 4) & 0x1000) != 0)) {
        style = (nk_style_button *)0x0;
      }
      local_28 = style;
      memcpy(local_d8,&local_10[2].text_normal,0xb0);
      nk_style_item_color((nk_style_item *)&stack0xfffffffffffffee0,local_8);
      nk_style_item_color((nk_style_item *)&stack0xfffffffffffffec0,local_8);
      nk_style_item_color((nk_style_item *)&stack0xfffffffffffffea0,local_8);
      r.y = (float)(int)in_stack_fffffffffffffed8;
      r.w = (float)(int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      r.x = (float)in_stack_fffffffffffffed4;
      r.h = in_stack_fffffffffffffee0;
      nVar2 = nk_do_button((nk_flags *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,r,
                           (nk_style_button *)in_stack_fffffffffffffeb8,
                           (nk_input *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
                           (nk_rect *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
      ;
      nk_draw_button((nk_command_buffer *)in_stack_fffffffffffffeb0,
                     (nk_rect *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     in_stack_fffffffffffffea4,style);
      local_4 = nVar2;
    }
  }
  return local_4;
}

Assistant:

NK_API nk_bool
nk_button_color(struct nk_context *ctx, struct nk_color color)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;
struct nk_style_button button;

int ret = 0;
struct nk_rect bounds;
struct nk_rect content;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

button = ctx->style.button;
button.normal = nk_style_item_color(color);
button.hover = nk_style_item_color(color);
button.active = nk_style_item_color(color);
ret = nk_do_button(&ctx->last_widget_state, &win->buffer, bounds,
&button, in, ctx->button_behavior, &content);
nk_draw_button(&win->buffer, &bounds, ctx->last_widget_state, &button);
return ret;
}